

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature.cpp
# Opt level: O0

void __thiscall
FixedElement::FixedElement
          (FixedElement *this,string *name,int start,int stop,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
          *interactions)

{
  invalid_argument *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *local_28;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *interactions_local;
  int stop_local;
  int start_local;
  string *name_local;
  FixedElement *this_local;
  
  local_28 = interactions;
  interactions_local._0_4_ = stop;
  interactions_local._4_4_ = start;
  _stop_local = name;
  name_local = (string *)this;
  std::enable_shared_from_this<FixedElement>::enable_shared_from_this
            (&this->super_enable_shared_from_this<FixedElement>);
  this->_vptr_FixedElement = (_func_int **)&PTR___cxa_pure_virtual_002aa2a0;
  std::__cxx11::string::string((string *)&this->name_,(string *)_stop_local);
  this->start_ = interactions_local._4_4_;
  this->stop_ = (int)interactions_local;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::map(&this->interactions_,local_28);
  std::__cxx11::string::string((string *)&this->gene_);
  this->covered_ = 0;
  this->old_covered_ = 0;
  this->reading_frame_ = -1;
  if ((-1 < this->start_) && (-1 < this->stop_)) {
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_78,"Fixed element \'",&this->name_);
  std::operator+(&local_58,&local_78,"\' has a negative start and/or stop coordinate.");
  std::invalid_argument::invalid_argument(this_00,(string *)&local_58);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

FixedElement::FixedElement(const std::string &name, int start, int stop,
                           const std::map<std::string, double> &interactions)
    : name_(name),
      start_(start),
      stop_(stop),
      interactions_(interactions),
      covered_(0),
      old_covered_(0),
      reading_frame_(-1) {
  if (start_ < 0 || stop_ < 0) {
    throw std::invalid_argument(
        "Fixed element '" + name_ +
        "' has a negative start and/or stop coordinate.");
  }
}